

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureGatherCase::TextureGatherCase
          (TextureGatherCase *this,Context *context,char *name,char *description,
          TextureType textureType,GatherType gatherType,OffsetSize offsetSize,
          TextureFormat textureFormat,CompareMode shadowCompareMode,WrapMode wrapS,WrapMode wrapT,
          MaybeTextureSwizzle *textureSwizzle,FilterMode minFilter,FilterMode magFilter,
          int baseLevel,deUint32 flags)

{
  ChannelType CVar1;
  TextureFormat TVar2;
  int i;
  long lVar3;
  ChannelType in_stack_0000000c;
  undefined4 in_stack_0000002c;
  
  TVar2.type = in_stack_0000000c;
  TVar2.order = offsetSize;
  gles31::TestCase::TestCase
            (&this->super_TestCase,context,name,glcts::fixed_sample_locations_values + 1);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureGatherCase_01e58630;
  this->m_gatherType = textureType;
  this->m_offsetSize = gatherType;
  this->m_textureFormat = TVar2;
  this->m_shadowCompareMode = textureFormat.order;
  this->m_wrapS = shadowCompareMode;
  this->m_wrapT = wrapS;
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    (this->m_textureSwizzle).m_swizzle.m_data[lVar3] =
         *(TextureSwizzleComponent *)(CONCAT44(in_stack_0000002c,wrapT) + lVar3 * 4);
  }
  (this->m_textureSwizzle).m_isSome = *(bool *)(CONCAT44(in_stack_0000002c,wrapT) + 0x10);
  this->m_minFilter = (FilterMode)textureSwizzle;
  this->m_magFilter = minFilter;
  this->m_baseLevel = magFilter;
  this->m_flags = baseLevel;
  this->m_textureType = (TextureType)description;
  CVar1 = UNORM_INT8;
  if ((offsetSize - 0x12 & 0xfffffffd) != 0) {
    CVar1 = in_stack_0000000c;
  }
  (this->m_colorBufferFormat).order = RGBA;
  (this->m_colorBufferFormat).type = CVar1;
  (this->m_colorBuffer).
  super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  .m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)2> *)0x0;
  (this->m_fbo).
  super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  .m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)3> *)0x0;
  this->m_currentIteration = 0;
  (this->m_program).super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.
  m_data.ptr = (ShaderProgram *)0x0;
  return;
}

Assistant:

TextureGatherCase::TextureGatherCase (Context&						context,
									  const char*					name,
									  const char*					description,
									  TextureType					textureType,
									  GatherType					gatherType,
									  OffsetSize					offsetSize,
									  tcu::TextureFormat			textureFormat,
									  tcu::Sampler::CompareMode		shadowCompareMode, //!< Should be COMPAREMODE_NONE iff textureType == TEXTURETYPE_NORMAL.
									  tcu::Sampler::WrapMode		wrapS,
									  tcu::Sampler::WrapMode		wrapT,
									  const MaybeTextureSwizzle&	textureSwizzle,
									  tcu::Sampler::FilterMode		minFilter,
									  tcu::Sampler::FilterMode		magFilter,
									  int							baseLevel,
									  deUint32						flags)
	: TestCase				(context, name, description)
	, m_gatherType			(gatherType)
	, m_offsetSize			(offsetSize)
	, m_textureFormat		(textureFormat)
	, m_shadowCompareMode	(shadowCompareMode)
	, m_wrapS				(wrapS)
	, m_wrapT				(wrapT)
	, m_textureSwizzle		(textureSwizzle)
	, m_minFilter			(minFilter)
	, m_magFilter			(magFilter)
	, m_baseLevel			(baseLevel)
	, m_flags				(flags)
	, m_textureType			(textureType)
	, m_colorBufferFormat	(tcu::TextureFormat(tcu::TextureFormat::RGBA,
												isDepthFormat(textureFormat) ? tcu::TextureFormat::UNORM_INT8 : textureFormat.type))
	, m_currentIteration	(0)
{
	DE_ASSERT((m_gatherType == GATHERTYPE_BASIC) == (m_offsetSize == OFFSETSIZE_NONE));
	DE_ASSERT((m_shadowCompareMode != tcu::Sampler::COMPAREMODE_NONE) == isDepthFormat(m_textureFormat));
	DE_ASSERT(isUnormFormatType(m_colorBufferFormat.type)						||
			  m_colorBufferFormat.type == tcu::TextureFormat::UNSIGNED_INT8		||
			  m_colorBufferFormat.type == tcu::TextureFormat::UNSIGNED_INT16	||
			  m_colorBufferFormat.type == tcu::TextureFormat::SIGNED_INT8		||
			  m_colorBufferFormat.type == tcu::TextureFormat::SIGNED_INT16);
	DE_ASSERT(glu::isGLInternalColorFormatFilterable(glu::getInternalFormat(m_colorBufferFormat)) ||
			  (m_magFilter == tcu::Sampler::NEAREST && (m_minFilter == tcu::Sampler::NEAREST || m_minFilter == tcu::Sampler::NEAREST_MIPMAP_NEAREST)));
	DE_ASSERT(isMipmapFilter(m_minFilter) || !(m_flags & GATHERCASE_MIPMAP_INCOMPLETE));
	DE_ASSERT(m_textureType == TEXTURETYPE_CUBE || !(m_flags & GATHERCASE_DONT_SAMPLE_CUBE_CORNERS));
	DE_ASSERT(!((m_flags & GATHERCASE_MIPMAP_INCOMPLETE) && isDepthFormat(m_textureFormat))); // It's not clear what shadow textures should return when incomplete.
}